

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::FindProgram
                   (string *__return_storage_ptr__,char *nameIn,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  allocator<char> local_59;
  string local_58;
  allocator<char> local_22;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool no_system_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *userPaths_local;
  char *nameIn_local;
  
  local_21 = no_system_path;
  pvStack_20 = userPaths;
  userPaths_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)nameIn;
  nameIn_local = (char *)__return_storage_ptr__;
  if ((nameIn == (char *)0x0) || (*nameIn == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_22);
    std::allocator<char>::~allocator(&local_22);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,nameIn,&local_59);
    FindProgram(__return_storage_ptr__,&local_58,pvStack_20,(bool)(local_21 & 1));
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::FindProgram(const char* nameIn,
                                     const std::vector<std::string>& userPaths,
                                     bool no_system_path)
{
  if (!nameIn || !*nameIn) {
    return "";
  }
  return SystemTools::FindProgram(std::string(nameIn), userPaths,
                                  no_system_path);
}